

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PulseQueuedTape.cpp
# Opt level: O1

Pulse __thiscall Storage::Tape::PulseQueuedTape::virtual_get_next_pulse(PulseQueuedTape *this)

{
  pointer pPVar1;
  pointer pPVar2;
  size_t sVar3;
  undefined8 uVar4;
  uint uVar5;
  Pulse PVar6;
  
  uVar4 = 0x100000002;
  uVar5 = 1;
  if (this->is_at_end_ == false) {
    pPVar1 = (this->queued_pulses_).
             super__Vector_base<Storage::Tape::Tape::Pulse,_std::allocator<Storage::Tape::Tape::Pulse>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (this->pulse_pointer_ ==
        ((long)(this->queued_pulses_).
               super__Vector_base<Storage::Tape::Tape::Pulse,_std::allocator<Storage::Tape::Tape::Pulse>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >> 2) * -0x5555555555555555
       ) {
      if ((this->queued_pulses_).
          super__Vector_base<Storage::Tape::Tape::Pulse,_std::allocator<Storage::Tape::Tape::Pulse>_>
          ._M_impl.super__Vector_impl_data._M_finish != pPVar1) {
        (this->queued_pulses_).
        super__Vector_base<Storage::Tape::Tape::Pulse,_std::allocator<Storage::Tape::Tape::Pulse>_>.
        _M_impl.super__Vector_impl_data._M_finish = pPVar1;
      }
      this->pulse_pointer_ = 0;
      (*(this->super_Tape)._vptr_Tape[9])(this);
      if ((this->is_at_end_ != false) ||
         (this->pulse_pointer_ ==
          ((long)(this->queued_pulses_).
                 super__Vector_base<Storage::Tape::Tape::Pulse,_std::allocator<Storage::Tape::Tape::Pulse>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->queued_pulses_).
                 super__Vector_base<Storage::Tape::Tape::Pulse,_std::allocator<Storage::Tape::Tape::Pulse>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555))
      goto LAB_00458958;
    }
    pPVar2 = (this->queued_pulses_).
             super__Vector_base<Storage::Tape::Tape::Pulse,_std::allocator<Storage::Tape::Tape::Pulse>_>
             ._M_impl.super__Vector_impl_data._M_start;
    sVar3 = this->pulse_pointer_;
    this->pulse_pointer_ = sVar3 + 1;
    pPVar1 = pPVar2 + sVar3;
    uVar4._0_4_ = pPVar1->type;
    uVar4._4_4_ = (pPVar1->length).length;
    uVar5 = pPVar2[sVar3].length.clock_rate;
  }
LAB_00458958:
  PVar6.length.clock_rate = uVar5;
  PVar6.type = (int)uVar4;
  PVar6.length.length = (int)((ulong)uVar4 >> 0x20);
  return PVar6;
}

Assistant:

Tape::Pulse PulseQueuedTape::virtual_get_next_pulse() {
	if(is_at_end_) {
		return silence();
	}

	if(pulse_pointer_ == queued_pulses_.size()) {
		clear();
		get_next_pulses();

		if(is_at_end_ || pulse_pointer_ == queued_pulses_.size()) {
			return silence();
		}
	}

	std::size_t read_pointer = pulse_pointer_;
	pulse_pointer_++;
	return queued_pulses_[read_pointer];
}